

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleTiming.c
# Opt level: O1

int SimpleTimingDoRender(void)

{
  double dVar1;
  int *piVar2;
  IceTDouble IVar3;
  int *piVar4;
  IceTInt *process_ranks;
  IceTUByte *color_buffer;
  void *recvbuf;
  long lVar5;
  int iVar6;
  char *pcVar7;
  float *pfVar8;
  int iVar9;
  int iVar10;
  IceTDouble *pIVar11;
  IceTImage IVar12;
  double *sendbuf;
  long lVar13;
  long lVar14;
  char *pcVar15;
  char *pcVar16;
  uint uVar17;
  ulong uVar18;
  IceTSizeType idx;
  int iVar19;
  long lVar20;
  int iVar21;
  float fVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  IceTInt num_proc;
  IceTInt rank;
  float bounds_max [3];
  float bounds_min [3];
  int plane_orientations [3];
  IceTDouble transformed_plane [4];
  IceTInt my_position;
  IceTDouble projection_matrix [16];
  IceTDouble modelview_matrix [16];
  IceTDouble inverse_transpose_transform [16];
  int local_398;
  uint local_394;
  IceTImage local_390;
  int *local_388;
  char *local_380;
  undefined8 local_378;
  float local_370;
  undefined8 local_36c;
  float local_364;
  double local_360;
  double local_358;
  double local_350;
  double local_348;
  int *local_340;
  int local_334;
  int *local_330;
  IceTFloat local_328;
  undefined4 uStack_324;
  undefined4 uStack_320;
  undefined4 uStack_31c;
  double local_310;
  uint auStack_304 [3];
  IceTDouble local_2f8 [7];
  double local_2c0;
  uint local_2b8 [64];
  IceTDouble local_1b8 [16];
  IceTDouble local_138 [16];
  IceTDouble local_b8 [17];
  
  local_358 = (double)CONCAT44(local_358._4_4_,SCREEN_WIDTH * g_num_tiles_x);
  local_360 = (double)CONCAT44(local_360._4_4_,(float)(SCREEN_HEIGHT * g_num_tiles_y));
  pIVar11 = g_opacity_lookup;
  lVar20 = 0;
  do {
    dVar25 = pow(2.718281828459045,(double)(int)lVar20 * -0.0009765625);
    *pIVar11 = (IceTDouble)(1.0 - dVar25);
    lVar20 = lVar20 + 1;
    pIVar11 = pIVar11 + 1;
  } while (lVar20 != 0x1001);
  icetGetIntegerv(2,(IceTInt *)&local_394);
  icetGetIntegerv(3,&local_398);
  if (g_colored_background == '\x01') {
    local_328 = 0.2;
    uStack_324 = 0x3f000000;
    uStack_320 = 0x3f333333;
    uStack_31c = 0x3f800000;
  }
  else {
    local_328 = 0.0;
    uStack_324 = 0;
    uStack_320 = 0;
    uStack_31c = 0;
  }
  icetDrawCallback(draw);
  if (g_transparent == '\x01') {
    icetCompositeMode(0x302);
    icetSetColorFormat(0xc002);
    icetSetDepthFormat(0xd000);
    icetEnable(0x143);
  }
  else {
    icetCompositeMode(0x301);
    icetSetColorFormat(0xc001);
    icetSetDepthFormat(0xd001);
  }
  if (g_no_interlace == '\x01') {
    icetDisable(0x145);
  }
  else {
    icetEnable(0x145);
  }
  if (g_no_collect == '\x01') {
    icetDisable(0x146);
  }
  else {
    icetEnable(0x146);
  }
  icetBoundingBoxd(-0.5,0.5,-0.5,0.5,-0.5,0.5);
  local_348 = (double)CONCAT44(local_348._4_4_,local_394);
  local_364 = -0.5;
  local_36c = 0xbf000000bf000000;
  local_370 = 0.5;
  local_378 = 0x3f0000003f000000;
  local_350 = (double)CONCAT44(local_350._4_4_,local_398);
  if (local_398 < 2) {
    local_330 = (int *)0x0;
  }
  else {
    local_330 = (int *)0x0;
    uVar18 = 0;
    iVar19 = 0;
    piVar4 = (int *)0x0;
    iVar10 = local_398;
    iVar21 = local_398;
    do {
      fVar22 = *(float *)((long)&local_36c + uVar18 * 4);
      local_380 = (char *)CONCAT44(local_380._4_4_,fVar22);
      local_390.opaque_internals._0_4_ = *(float *)((long)&local_378 + uVar18 * 4) - fVar22;
      iVar9 = (iVar10 + iVar19) / 2;
      local_388 = piVar4;
      local_340 = local_330;
      piVar4 = (int *)malloc(0x18);
      iVar6 = iVar9 - iVar19;
      fVar22 = ((float)iVar6 * local_390.opaque_internals._0_4_) / (float)iVar21 + local_380._0_4_;
      *piVar4 = (int)uVar18;
      piVar4[1] = (int)fVar22;
      piVar4[4] = 0;
      piVar4[5] = 0;
      if (local_348._0_4_ < iVar9) {
        pfVar8 = (float *)((long)&local_378 + uVar18 * 4);
        piVar4[2] = -1;
        iVar6 = iVar10 - iVar9;
        iVar10 = iVar9;
      }
      else {
        pfVar8 = (float *)((long)&local_36c + uVar18 * 4);
        piVar4[2] = 1;
        iVar19 = iVar9;
      }
      piVar4[3] = iVar6;
      *pfVar8 = fVar22;
      local_330 = piVar4;
      if (local_388 != (int *)0x0) {
        *(int **)(local_388 + 4) = piVar4;
        local_330 = local_340;
      }
      uVar17 = (int)uVar18 + 1;
      if (uVar17 == 3) {
        uVar17 = 0;
      }
      uVar18 = (ulong)uVar17;
      iVar21 = iVar10 - iVar19;
    } while (1 < iVar21);
  }
  if (local_350._0_4_ < g_num_tiles_y * g_num_tiles_x) {
    printf("Not enough processes to %dx%d tiles.\n");
    iVar10 = -3;
  }
  else {
    local_388 = (int *)CONCAT44(local_388._4_4_,(float)local_358._0_4_ / local_360._0_4_);
    icetResetTiles();
    if (0 < g_num_tiles_y) {
      iVar10 = 0;
      iVar19 = 0;
      do {
        if (0 < g_num_tiles_x) {
          iVar21 = 0;
          do {
            icetAddTile(SCREEN_WIDTH * iVar21,SCREEN_HEIGHT * iVar10,SCREEN_WIDTH,SCREEN_HEIGHT,
                        iVar19 + iVar21);
            iVar21 = iVar21 + 1;
          } while (iVar21 < g_num_tiles_x);
          iVar19 = iVar19 + iVar21;
        }
        iVar10 = iVar10 + 1;
      } while (iVar10 < g_num_tiles_y);
    }
    icetStrategy(g_strategy);
    icetSingleImageStrategy(g_single_image_strategy);
    icetMatrixFrustum((IceTDouble)((double)local_388._0_4_ * -0.65),
                      (IceTDouble)((double)local_388._0_4_ * 0.65),-0.65,0.65,3.0,5.0,local_1b8);
    iVar10 = (int)local_394 % 10;
    if (iVar10 < 7) {
      iVar19 = iVar10 + 1;
      uVar17 = (iVar10 - (iVar19 >> 0x1f)) + 1;
      g_color[1] = (float)(int)(((int)uVar17 >> 1) -
                               (((int)uVar17 >> 1) - ((int)uVar17 >> 0x1f) & 0xfffffffeU));
      g_color[0] = (float)(int)((iVar10 - (uVar17 & 0xfffffffe)) + 1);
      iVar10 = iVar10 + 4;
      if (-1 < iVar19) {
        iVar10 = iVar19;
      }
      g_color[2] = (float)(int)((iVar10 >> 2) - ((iVar10 >> 2) - (iVar10 >> 0x1f) & 0xfffffffeU));
    }
    else {
      g_color[2] = 0.5;
      g_color[0] = 0.5;
      g_color[1] = 0.5;
      (&g_num_tiles_y)[iVar10] = 0;
    }
    g_color[3] = 1.0;
    if (local_394 == 0) {
      printf("Seed = %d\n",(ulong)(uint)g_seed);
      if (1 < local_398) {
        iVar10 = 1;
        do {
          icetCommSend(&g_seed,1,0x8003,iVar10,0x21);
          iVar10 = iVar10 + 1;
        } while (iVar10 < local_398);
      }
    }
    else {
      icetCommRecv(&g_seed,1,0x8003,0,0x21);
    }
    srand(g_seed);
    lVar20 = (long)g_num_frames;
    local_388 = (int *)malloc(lVar20 * 0x50);
    if (0 < lVar20) {
      local_340 = (int *)(double)(float)local_36c;
      local_348 = (double)local_36c._4_4_;
      local_350 = (double)local_364;
      local_358 = (double)((float)local_378 - (float)local_36c);
      local_360 = (double)(local_378._4_4_ - local_36c._4_4_);
      local_310 = (double)(local_370 - local_364);
      IVar12.opaque_internals = (IceTVoid *)0x0;
      do {
        icetCommBarrier();
        local_380 = (char *)icetWallTime();
        icetMatrixIdentity(local_138);
        icetMatrixMultiplyTranslate(local_138,0.0,0.0,-4.0);
        iVar10 = rand();
        icetMatrixMultiplyRotate
                  (local_138,(IceTDouble)(((double)iVar10 * 360.0) / 2147483647.0),1.0,0.0,0.0);
        iVar10 = rand();
        icetMatrixMultiplyRotate
                  (local_138,(IceTDouble)(((double)iVar10 * 360.0) / 2147483647.0),0.0,1.0,0.0);
        iVar10 = rand();
        icetMatrixMultiplyRotate
                  (local_138,(IceTDouble)(((double)iVar10 * 360.0) / 2147483647.0),0.0,0.0,1.0);
        if (g_transparent == '\x01') {
          local_390.opaque_internals = IVar12.opaque_internals;
          local_334 = icetCommSize();
          icetMatrixMultiply((IceTDouble *)local_2b8,local_1b8,local_138);
          icetMatrixInverseTranspose((IceTDouble *)local_2b8,local_b8);
          lVar20 = 0;
          do {
            local_2f8[0] = 0.0;
            local_2f8[1] = 0.0;
            local_2f8[2] = 0.0;
            local_2f8[3] = 0.0;
            local_2f8[lVar20] = 1.0;
            icetMatrixVectorMultiply(local_2f8 + 4,local_b8,local_2f8);
            auStack_304[lVar20] = (uint)(local_2c0 < 0.0) * 2 - 1;
            lVar20 = lVar20 + 1;
          } while (lVar20 != 3);
          local_2b8[0] = 0;
          if (local_330 != (int *)0x0) {
            uVar17 = 0;
            piVar4 = local_330;
            do {
              if (((int)(piVar4[2] & auStack_304[*piVar4]) < 0) ||
                 (0 < (int)auStack_304[*piVar4] && 0 < piVar4[2])) {
                uVar17 = uVar17 + piVar4[3];
                local_2b8[0] = uVar17;
              }
              piVar4 = *(int **)(piVar4 + 4);
            } while (piVar4 != (int *)0x0);
          }
          process_ranks = (IceTInt *)malloc((long)local_334 << 2);
          icetCommAllgather(local_2b8,1,0x8003,process_ranks);
          icetEnable(0x142);
          icetCompositeOrder(process_ranks);
          free(process_ranks);
          IVar12.opaque_internals = local_390.opaque_internals;
        }
        icetMatrixMultiplyTranslate
                  (local_138,(IceTDouble)local_340,(IceTDouble)local_348,(IceTDouble)local_350);
        icetMatrixMultiplyScale
                  (local_138,(IceTDouble)local_358,(IceTDouble)local_360,(IceTDouble)local_310);
        icetMatrixMultiplyTranslate(local_138,0.5,0.5,0.5);
        g_first_render = 1;
        local_390 = icetDrawFrame(local_1b8,local_138,&local_328);
        icetCommBarrier();
        IVar3 = icetWallTime();
        piVar4 = local_388;
        local_380 = (char *)((double)IVar3 - (double)local_380);
        lVar20 = (long)IVar12.opaque_internals * 0x50;
        icetGetDoublev(0xc1,(IceTDouble *)((long)local_388 + lVar20));
        icetGetDoublev(0xc2,(IceTDouble *)((long)piVar4 + lVar20 + 8));
        icetGetDoublev(0xc3,(IceTDouble *)((long)piVar4 + lVar20 + 0x10));
        icetGetDoublev(0xc4,(IceTDouble *)((long)piVar4 + lVar20 + 0x18));
        icetGetDoublev(0xc5,(IceTDouble *)((long)piVar4 + lVar20 + 0x20));
        icetGetDoublev(200,(IceTDouble *)((long)piVar4 + lVar20 + 0x28));
        icetGetDoublev(0xc6,(IceTDouble *)((long)piVar4 + lVar20 + 0x30));
        icetGetDoublev(199,(IceTDouble *)((long)piVar4 + lVar20 + 0x38));
        icetGetIntegerv(0xc9,(IceTInt *)((long)piVar4 + lVar20 + 0x40));
        *(char **)((long)piVar4 + lVar20 + 0x48) = local_380;
        if (((g_write_image == '\x01') && (IVar12.opaque_internals == (IceTVoid *)0x0)) &&
           ((int)local_394 < g_num_tiles_y * g_num_tiles_x)) {
          color_buffer = (IceTUByte *)malloc((long)(SCREEN_WIDTH * SCREEN_HEIGHT * 4));
          icetImageCopyColorub(local_390,color_buffer,0xc001);
          sprintf((char *)local_2b8,"SimpleTiming%02d.ppm",(ulong)local_394);
          write_ppm((char *)local_2b8,color_buffer,SCREEN_WIDTH,SCREEN_HEIGHT);
          free(color_buffer);
        }
        IVar12.opaque_internals = IVar12.opaque_internals + 1;
      } while ((long)IVar12.opaque_internals < (long)g_num_frames);
    }
    recvbuf = malloc((long)local_398 * 0x50);
    local_380 = icetGetStrategyName();
    if (g_single_image_strategy == 0x7004) {
      icetGetIntegerv(0x40,(IceTInt *)local_2b8);
      local_390.opaque_internals = SimpleTimingDoRender::name_buffer;
      sprintf(SimpleTimingDoRender::name_buffer,"radix-k %d",(ulong)local_2b8[0]);
    }
    else {
      local_390.opaque_internals = icetGetSingleImageStrategyName();
    }
    icetGetIntegerv(0x41,(IceTInt *)local_2b8);
    if (0 < g_num_frames) {
      lVar20 = 0;
      do {
        sendbuf = (double *)(lVar20 * 0x50 + (long)local_388);
        icetCommGather(sendbuf,0x50,0x8001,recvbuf,0);
        if (local_394 == 0) {
          lVar13 = (long)local_398;
          if (lVar13 < 1) {
            lVar5 = 0;
          }
          else {
            uVar23 = SUB84(*sendbuf,0);
            uVar24 = (undefined4)((ulong)*sendbuf >> 0x20);
            dVar25 = sendbuf[1];
            dVar26 = sendbuf[2];
            dVar27 = sendbuf[3];
            dVar28 = sendbuf[4];
            dVar29 = sendbuf[5];
            dVar30 = sendbuf[6];
            dVar31 = sendbuf[7];
            iVar10 = *(int *)(sendbuf + 8);
            dVar32 = sendbuf[9];
            lVar14 = 0;
            lVar5 = 0;
            do {
              dVar1 = *(double *)((long)recvbuf + lVar14);
              if ((double)CONCAT44(uVar24,uVar23) <= dVar1 &&
                  dVar1 != (double)CONCAT44(uVar24,uVar23)) {
                *sendbuf = dVar1;
                uVar23 = SUB84(dVar1,0);
                uVar24 = (undefined4)((ulong)dVar1 >> 0x20);
              }
              dVar1 = *(double *)((long)recvbuf + lVar14 + 8);
              if (dVar25 < dVar1) {
                sendbuf[1] = dVar1;
                dVar25 = dVar1;
              }
              dVar1 = *(double *)((long)recvbuf + lVar14 + 0x10);
              if (dVar26 < dVar1) {
                sendbuf[2] = dVar1;
                dVar26 = dVar1;
              }
              dVar1 = *(double *)((long)recvbuf + lVar14 + 0x18);
              if (dVar27 < dVar1) {
                sendbuf[3] = dVar1;
                dVar27 = dVar1;
              }
              dVar1 = *(double *)((long)recvbuf + lVar14 + 0x20);
              if (dVar28 < dVar1) {
                sendbuf[4] = dVar1;
                dVar28 = dVar1;
              }
              dVar1 = *(double *)((long)recvbuf + lVar14 + 0x28);
              if (dVar29 < dVar1) {
                sendbuf[5] = dVar1;
                dVar29 = dVar1;
              }
              dVar1 = *(double *)((long)recvbuf + lVar14 + 0x30);
              if (dVar30 < dVar1) {
                sendbuf[6] = dVar1;
                dVar30 = dVar1;
              }
              dVar1 = *(double *)((long)recvbuf + lVar14 + 0x38);
              if (dVar31 < dVar1) {
                sendbuf[7] = dVar1;
                dVar31 = dVar1;
              }
              iVar19 = *(int *)((long)recvbuf + lVar14 + 0x40);
              if (iVar10 < iVar19) {
                *(int *)(sendbuf + 8) = iVar19;
                iVar10 = iVar19;
              }
              dVar1 = *(double *)((long)recvbuf + lVar14 + 0x48);
              if (dVar32 < dVar1) {
                sendbuf[9] = dVar1;
                dVar32 = dVar1;
              }
              lVar5 = lVar5 + iVar19;
              lVar14 = lVar14 + 0x50;
            } while (lVar13 * 0x50 != lVar14);
          }
          pcVar7 = "no";
          if (g_transparent != '\0') {
            pcVar7 = "yes";
          }
          pcVar15 = "yes";
          if (g_no_interlace != '\0') {
            pcVar15 = "no";
          }
          pcVar16 = "yes";
          if (g_no_collect != '\0') {
            pcVar16 = "no";
          }
          printf("LOG,%d,%s,%s,%d,%d,%d,%d,%s,%s,%s,%d,%d,%lg,%lg,%lg,%lg,%lg,%lg,%lg,%lg,%ld,%lg\n"
                 ,SUB84(*sendbuf,0),sendbuf[1],sendbuf[2],sendbuf[3],sendbuf[4],sendbuf[5],
                 sendbuf[6],sendbuf[7],lVar13,local_380,local_390.opaque_internals,
                 (ulong)(uint)g_num_tiles_x,(ulong)(uint)g_num_tiles_y,SCREEN_WIDTH,SCREEN_HEIGHT,
                 pcVar7,pcVar15,pcVar16,local_2b8[0],(int)lVar20,lVar5,sendbuf[9]);
        }
        lVar20 = lVar20 + 1;
      } while (lVar20 < g_num_frames);
    }
    free(recvbuf);
    piVar4 = local_330;
    while (piVar4 != (int *)0x0) {
      piVar2 = *(int **)(piVar4 + 4);
      free(piVar4);
      piVar4 = piVar2;
    }
    free(local_388);
    iVar10 = 0;
    icetCommBarrier();
  }
  return iVar10;
}

Assistant:

static int SimpleTimingDoRender()
{
    IceTInt rank;
    IceTInt num_proc;

    float aspect = (  (float)(g_num_tiles_x*SCREEN_WIDTH)
                    / (float)(g_num_tiles_y*SCREEN_HEIGHT) );
    int frame;
    float bounds_min[3];
    float bounds_max[3];
    region_divide region_divisions;

    IceTDouble projection_matrix[16];
    IceTFloat background_color[4];

    timings_type *timing_array;

    /* Normally, the first thing that you do is set up your communication and
     * then create at least one IceT context.  This has already been done in the
     * calling function (i.e. icetTests_mpi.c).  See the init_mpi_comm in
     * mpi_comm.h for an example.
     */

    init_opacity_lookup();

    /* If we had set up the communication layer ourselves, we could have gotten
     * these parameters directly from it.  Since we did not, this provides an
     * alternate way. */
    icetGetIntegerv(ICET_RANK, &rank);
    icetGetIntegerv(ICET_NUM_PROCESSES, &num_proc);

    if (g_colored_background) {
        background_color[0] = 0.2f;
        background_color[1] = 0.5f;
        background_color[2] = 0.7f;
        background_color[3] = 1.0f;
    } else {
        background_color[0] = 0.0f;
        background_color[1] = 0.0f;
        background_color[2] = 0.0f;
        background_color[3] = 0.0f;
    }

    /* Give IceT a function that will issue the drawing commands. */
    icetDrawCallback(draw);

    /* Other IceT state. */
    if (g_transparent) {
        icetCompositeMode(ICET_COMPOSITE_MODE_BLEND);
        icetSetColorFormat(ICET_IMAGE_COLOR_RGBA_FLOAT);
        icetSetDepthFormat(ICET_IMAGE_DEPTH_NONE);
        icetEnable(ICET_CORRECT_COLORED_BACKGROUND);
    } else {
        icetCompositeMode(ICET_COMPOSITE_MODE_Z_BUFFER);
        icetSetColorFormat(ICET_IMAGE_COLOR_RGBA_UBYTE);
        icetSetDepthFormat(ICET_IMAGE_DEPTH_FLOAT);
    }

    if (g_no_interlace) {
        icetDisable(ICET_INTERLACE_IMAGES);
    } else {
        icetEnable(ICET_INTERLACE_IMAGES);
    }

    if (g_no_collect) {
        icetDisable(ICET_COLLECT_IMAGES);
    } else {
        icetEnable(ICET_COLLECT_IMAGES);
    }

    /* Give IceT the bounds of the polygons that will be drawn.  Note that IceT
     * will take care of any transformation that gets passed to
     * icetDrawFrame. */
    icetBoundingBoxd(-0.5f, 0.5f, -0.5, 0.5, -0.5, 0.5);

    /* Determine the region we want the local geometry to be in.  This will be
     * used for the modelview transformation later. */
    find_region(rank, num_proc, bounds_min, bounds_max, &region_divisions);

    /* Set up the tiled display.  The asignment of displays to processes is
     * arbitrary because, as this is a timing test, I am not too concerned
     * about who shows what. */
    if (g_num_tiles_x*g_num_tiles_y <= num_proc) {
        int x, y, display_rank;
        icetResetTiles();
        display_rank = 0;
        for (y = 0; y < g_num_tiles_y; y++) {
            for (x = 0; x < g_num_tiles_x; x++) {
                icetAddTile(x*(IceTInt)SCREEN_WIDTH,
                            y*(IceTInt)SCREEN_HEIGHT,
                            SCREEN_WIDTH,
                            SCREEN_HEIGHT,
                            display_rank);
                display_rank++;
            }
        }
    } else {
        printf("Not enough processes to %dx%d tiles.\n",
               g_num_tiles_x, g_num_tiles_y);
        return TEST_FAILED;
    }

    icetStrategy(g_strategy);
    icetSingleImageStrategy(g_single_image_strategy);

    /* Set up the projection matrix. */
    icetMatrixFrustum(-0.65*aspect, 0.65*aspect, -0.65, 0.65, 3.0, 5.0,
                      projection_matrix);

    if (rank%10 < 7) {
        IceTInt color_bits = rank%10 + 1;
        g_color[0] = (float)(color_bits%2);
        g_color[1] = (float)((color_bits/2)%2);
        g_color[2] = (float)((color_bits/4)%2);
        g_color[3] = 1.0f;
    } else {
        g_color[0] = g_color[1] = g_color[2] = 0.5f;
        g_color[rank%10 - 7] = 0.0f;
        g_color[3] = 1.0f;
    }

    /* Initialize randomness. */
    if (rank == 0) {
        int i;
        printf("Seed = %d\n", g_seed);
        for (i = 1; i < num_proc; i++) {
            icetCommSend(&g_seed, 1, ICET_INT, i, 33);
        }
    } else {
        icetCommRecv(&g_seed, 1, ICET_INT, 0, 33);
    }

    srand(g_seed);

    timing_array = malloc(g_num_frames * sizeof(timings_type));

    for (frame = 0; frame < g_num_frames; frame++) {
        IceTDouble elapsed_time;
        IceTDouble modelview_matrix[16];
        IceTImage image;

        /* Get everyone to start at the same time. */
        icetCommBarrier();

        elapsed_time = icetWallTime();

        /* We can set up a modelview matrix here and IceT will factor this in
         * determining the screen projection of the geometry. */
        icetMatrixIdentity(modelview_matrix);

        /* Move geometry back so that it can be seen by the camera. */
        icetMatrixMultiplyTranslate(modelview_matrix, 0.0, 0.0, -4.0);

        /* Rotate to some random view. */
        icetMatrixMultiplyRotate(modelview_matrix,
                                 (360.0*rand())/RAND_MAX, 1.0, 0.0, 0.0);
        icetMatrixMultiplyRotate(modelview_matrix,
                                 (360.0*rand())/RAND_MAX, 0.0, 1.0, 0.0);
        icetMatrixMultiplyRotate(modelview_matrix,
                                 (360.0*rand())/RAND_MAX, 0.0, 0.0, 1.0);

        /* Determine view ordering of geometry based on camera position
           (represented by the current projection and modelview matrices). */
        if (g_transparent) {
            find_composite_order(projection_matrix,
                                 modelview_matrix,
                                 region_divisions);
        }

        /* Translate the unit box centered on the origin to the region specified
         * by bounds_min and bounds_max. */
        icetMatrixMultiplyTranslate(modelview_matrix,
                                    bounds_min[0],
                                    bounds_min[1],
                                    bounds_min[2]);
        icetMatrixMultiplyScale(modelview_matrix,
                                bounds_max[0] - bounds_min[0],
                                bounds_max[1] - bounds_min[1],
                                bounds_max[2] - bounds_min[2]);
        icetMatrixMultiplyTranslate(modelview_matrix, 0.5, 0.5, 0.5);

      /* Instead of calling draw() directly, call it indirectly through
       * icetDrawFrame().  IceT will automatically handle image
       * compositing. */
        g_first_render = ICET_TRUE;
        image = icetDrawFrame(projection_matrix,
                              modelview_matrix,
                              background_color);

        /* Let everyone catch up before finishing the frame. */
        icetCommBarrier();

        elapsed_time = icetWallTime() - elapsed_time;

        /* Print timings to logging. */
        icetGetDoublev(ICET_RENDER_TIME,
                       &timing_array[frame].render_time);
        icetGetDoublev(ICET_BUFFER_READ_TIME,
                       &timing_array[frame].buffer_read_time);
        icetGetDoublev(ICET_BUFFER_WRITE_TIME,
                       &timing_array[frame].buffer_write_time);
        icetGetDoublev(ICET_COMPRESS_TIME,
                       &timing_array[frame].compress_time);
        icetGetDoublev(ICET_BLEND_TIME,
                       &timing_array[frame].blend_time);
        icetGetDoublev(ICET_TOTAL_DRAW_TIME,
                       &timing_array[frame].draw_time);
        icetGetDoublev(ICET_COMPOSITE_TIME,
                       &timing_array[frame].composite_time);
        icetGetDoublev(ICET_COLLECT_TIME,
                       &timing_array[frame].collect_time);
        icetGetIntegerv(ICET_BYTES_SENT,
                        &timing_array[frame].bytes_sent);
        timing_array[frame].frame_time = elapsed_time;

        /* Write out image to verify rendering occurred correctly. */
        if (   g_write_image
            && (rank < (g_num_tiles_x*g_num_tiles_y))
            && (frame == 0)
               ) {
            IceTUByte *buffer = malloc(SCREEN_WIDTH*SCREEN_HEIGHT*4);
            char filename[256];
            icetImageCopyColorub(image, buffer, ICET_IMAGE_COLOR_RGBA_UBYTE);
            sprintf(filename, "SimpleTiming%02d.ppm", rank);
            write_ppm(filename, buffer, (int)SCREEN_WIDTH, (int)SCREEN_HEIGHT);
            free(buffer);
        }
    }

    /* Print logging header. */
    {
        timings_type *timing_collection = malloc(num_proc*sizeof(timings_type));
        const char *strategy_name;
        const char *si_strategy_name;
        IceTInt max_image_split;

        strategy_name = icetGetStrategyName();
        if (g_single_image_strategy == ICET_SINGLE_IMAGE_STRATEGY_RADIXK) {
            static char name_buffer[256];
            IceTInt magic_k;

            icetGetIntegerv(ICET_MAGIC_K, &magic_k);
            sprintf(name_buffer, "radix-k %d", (int)magic_k);
            si_strategy_name = name_buffer;
        } else {
            si_strategy_name = icetGetSingleImageStrategyName();
        }

        icetGetIntegerv(ICET_MAX_IMAGE_SPLIT, &max_image_split);

        for (frame = 0; frame < g_num_frames; frame++) {
            timings_type *timing = &timing_array[frame];

            icetCommGather(timing,
                           sizeof(timings_type),
                           ICET_BYTE,
                           timing_collection,
                           0);

            if (rank == 0) {
                int p;
                IceTInt64 total_bytes_sent = 0;

                for (p = 0; p < num_proc; p++) {
#define UPDATE_MAX(field) if (timing->field < timing_collection[p].field) timing->field = timing_collection[p].field;
                    UPDATE_MAX(render_time);
                    UPDATE_MAX(buffer_read_time);
                    UPDATE_MAX(buffer_write_time);
                    UPDATE_MAX(compress_time);
                    UPDATE_MAX(blend_time);
                    UPDATE_MAX(draw_time);
                    UPDATE_MAX(composite_time);
                    UPDATE_MAX(collect_time);
                    UPDATE_MAX(bytes_sent);
                    UPDATE_MAX(frame_time);
                    total_bytes_sent += timing_collection[p].bytes_sent;
                }

                printf("LOG,%d,%s,%s,%d,%d,%d,%d,%s,%s,%s,%d,%d,%lg,%lg,%lg,%lg,%lg,%lg,%lg,%lg,%ld,%lg\n",
                       num_proc,
                       strategy_name,
                       si_strategy_name,
                       g_num_tiles_x,
                       g_num_tiles_y,
                       SCREEN_WIDTH,
                       SCREEN_HEIGHT,
                       g_transparent ? "yes" : "no",
                       g_no_interlace ? "no" : "yes",
                       g_no_collect ? "no" : "yes",
                       max_image_split,
                       frame,
                       timing->render_time,
                       timing->buffer_read_time,
                       timing->buffer_write_time,
                       timing->compress_time,
                       timing->blend_time,
                       timing->draw_time,
                       timing->composite_time,
                       timing->collect_time,
                       (long int)total_bytes_sent,
                       timing->frame_time);
            }
        }

        free(timing_collection);
    }

    free_region_divide(region_divisions);
    free(timing_array);

    /* This is to prevent a non-root from printing while the root is writing
       the log. */
    icetCommBarrier();

    return TEST_PASSED;
}